

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_157d774::looksLikeSpecialVariable
          (anon_unknown_dwarf_157d774 *this,string *var,static_string_view prefix,size_t varNameLen)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  string_view prefix_00;
  string_view str;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  local_58.View_._M_str = (char *)prefix.super_string_view._M_len;
  if (prefix.super_string_view._M_str < (char *)((long)&(var->_M_dataplus)._M_p + 3U)) {
    bVar3 = false;
  }
  else {
    pcVar1 = *(char **)this;
    sVar2 = *(size_t *)(this + 8);
    local_88.View_._M_str = local_88.Digits_;
    local_88.View_._M_len = 1;
    local_88.Digits_[0] = '{';
    local_58.View_._M_len = (size_t)var;
    cmStrCat<>(&local_a8,&local_58,&local_88);
    prefix_00._M_str = local_a8._M_dataplus._M_p;
    prefix_00._M_len = local_a8._M_string_length;
    str._M_str = pcVar1;
    str._M_len = sVar2;
    bVar3 = cmHasPrefix(str,prefix_00);
    if (bVar3) {
      bVar3 = prefix.super_string_view._M_str[*(long *)this + -1] == '}';
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return bVar3;
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}